

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::CLUFactor<double>::updateRow
          (CLUFactor<double> *this,int r,int lv,int prow,int pcol,double pval,double eps)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  pointer pdVar5;
  int *piVar6;
  double *pdVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  Pring *pPVar12;
  Pring *pPVar13;
  Pring *pPVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int *piVar18;
  int *piVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  double dVar25;
  double dVar26;
  
  piVar3 = (this->u).row.len;
  iVar23 = (this->u).row.start[r];
  iVar2 = piVar3[r];
  piVar3[r] = iVar2 + -1;
  iVar20 = iVar2 + iVar23 + -1;
  piVar4 = (this->u).row.idx;
  lVar21 = (long)iVar20;
  lVar24 = lVar21 * 4 + 4;
  do {
    lVar22 = lVar24 + -4;
    lVar15 = lVar24 + -4;
    lVar24 = lVar22;
  } while (*(int *)((long)piVar4 + lVar15) != pcol);
  pdVar5 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar26 = *(double *)((long)pdVar5 + lVar22 * 2) / pval;
  (this->l).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lv] = dVar26;
  (this->l).idx[lv] = r;
  *(int *)((long)piVar4 + lVar22) = piVar4[iVar20];
  *(double *)((long)pdVar5 + lVar22 * 2) = pdVar5[iVar20];
  iVar16 = piVar3[prow];
  if (1 < iVar2) {
    piVar6 = (this->temp).s_mark;
    pdVar7 = this->work;
    piVar8 = (this->temp).s_cact;
    piVar9 = (this->u).col.len;
    piVar10 = (this->u).col.idx;
    piVar11 = (this->u).col.start;
    do {
      iVar2 = piVar4[lVar21 + -1];
      lVar21 = lVar21 + -1;
      if (piVar6[iVar2] != 0) {
        piVar6[iVar2] = 0;
        iVar16 = iVar16 + -1;
        dVar25 = pdVar5[lVar21] - pdVar7[iVar2] * dVar26;
        pdVar5[lVar21] = dVar25;
        if (ABS(dVar25) <= eps) {
          piVar3[r] = piVar3[r] + -1;
          pdVar5[lVar21] = pdVar5[(long)iVar20 + -1];
          piVar4[lVar21] = piVar4[(long)iVar20 + -1];
          piVar18 = piVar8 + iVar2;
          *piVar18 = *piVar18 + -1;
          iVar20 = iVar20 + -1;
          iVar17 = piVar9[iVar2] + -1;
          piVar9[iVar2] = iVar17;
          lVar24 = (long)(iVar17 + piVar11[iVar2]);
          piVar18 = piVar10 + lVar24 + 1;
          do {
            piVar19 = piVar18 + -1;
            piVar1 = piVar18 + -1;
            piVar18 = piVar19;
          } while (*piVar1 != r);
          *piVar19 = piVar10[lVar24];
        }
      }
    } while (iVar23 < lVar21);
  }
  iVar23 = piVar3[r];
  iVar16 = iVar16 + iVar23;
  if ((this->u).row.max[r] < iVar16) {
    remaxRow(this,r,iVar16);
  }
  lVar24 = (long)(this->u).row.len[prow];
  if (0 < lVar24) {
    piVar3 = (this->u).row.start;
    lVar21 = (long)piVar3[prow];
    lVar24 = lVar24 + lVar21;
    iVar23 = iVar23 + piVar3[r];
    do {
      piVar3 = (this->u).row.idx;
      piVar4 = (this->temp).s_mark;
      iVar2 = piVar3[lVar21];
      if (piVar4[iVar2] == 0) {
        piVar4[iVar2] = 1;
      }
      else {
        dVar25 = -this->work[iVar2] * dVar26;
        if (eps < ABS(dVar25)) {
          (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar23] = dVar25;
          piVar3[iVar23] = iVar2;
          piVar3 = (this->u).row.len + r;
          *piVar3 = *piVar3 + 1;
          iVar20 = (this->u).col.len[iVar2];
          if ((this->u).col.max[iVar2] <= iVar20) {
            remaxCol(this,iVar2,iVar20 + 1);
          }
          iVar23 = iVar23 + 1;
          piVar3 = (this->u).col.idx;
          iVar20 = (this->u).col.start[iVar2];
          piVar4 = (this->u).col.len;
          iVar16 = piVar4[iVar2];
          piVar4[iVar2] = iVar16 + 1;
          piVar3[(long)iVar20 + (long)iVar16] = r;
          piVar3 = (this->temp).s_cact + iVar2;
          *piVar3 = *piVar3 + 1;
        }
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < lVar24);
  }
  pPVar12 = (this->temp).pivot_row;
  pPVar13 = pPVar12[r].next;
  pPVar13->prev = pPVar12[r].prev;
  (pPVar12[r].prev)->next = pPVar13;
  pPVar13 = (this->temp).pivot_rowNZ;
  iVar23 = (this->u).row.len[r];
  pPVar14 = pPVar13[iVar23].next;
  pPVar12[r].next = pPVar14;
  pPVar14->prev = pPVar12 + r;
  pPVar12[r].prev = pPVar13 + iVar23;
  pPVar13[iVar23].next = pPVar12 + r;
  (this->temp).s_max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[r] = -1.0;
  return lv + 1;
}

Assistant:

int CLUFactor<R>::updateRow(int r,
                            int lv,
                            int prow,
                            int pcol,
                            R pval,
                            R eps)
{
   int fill;
   R x, lx;
   int c, i, j, k, ll, m, n;

   n = u.row.start[r];
   m = --(u.row.len[r]) + n;

   /*  compute L VectorBase<R> entry and
    *  and remove pivot column form row file
    */

   for(j = m; u.row.idx[j] != pcol; --j)
      ;

   lx = u.row.val[j] / pval;

   l.val[lv] = lx;

   l.idx[lv] = r;

   ++lv;

   u.row.idx[j] = u.row.idx[m];

   u.row.val[j] = u.row.val[m];


   /*  update loop (I) and
    *  computing expected fill
    */
   fill = u.row.len[prow];

   for(j = m - 1; j >= n; --j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         /*  count fill elements.
          */
         temp.s_mark[c] = 0;
         --fill;

         /*  update row values
          */
         x = u.row.val[j] -= work[c] * lx;

         if(isZero(x, eps))
         {
            /* Eliminate zero from row r
             */
            --u.row.len[r];
            --m;
            u.row.val[j] = u.row.val[m];
            u.row.idx[j] = u.row.idx[m];

            /* Eliminate zero from column c
             */
            --(temp.s_cact[c]);
            k = --(u.col.len[c]) + u.col.start[c];

            for(i = k; u.col.idx[i] != r; --i)
               ;

            u.col.idx[i] = u.col.idx[k];
         }
      }
   }


   /*  create space for fill in row file
    */
   ll = u.row.len[r];

   if(ll + fill > u.row.max[r])
      remaxRow(r, ll + fill);

   ll += u.row.start[r];

   /*  fill creating update loop (II)
    */
   for(j = u.row.start[prow], m = j + u.row.len[prow]; j < m; ++j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         x = - work[c] * lx;

         if(isNotZero(x, eps))
         {
            /* produce fill element in row r
             */
            u.row.val[ll] = x;
            u.row.idx[ll] = c;
            ll++;
            u.row.len[r]++;

            /* produce fill element in column c
             */

            if(u.col.len[c] >= u.col.max[c])
               remaxCol(c, u.col.len[c] + 1);

            u.col.idx[u.col.start[c] + (u.col.len[c])++] = r;

            temp.s_cact[c]++;
         }
      }
      else
         temp.s_mark[c] = 1;
   }

   /*  move row to appropriate list.
    */
   removeDR(temp.pivot_row[r]);

   init2DR(temp.pivot_row[r], temp.pivot_rowNZ[u.row.len[r]]);

   assert(row.perm[r] < 0);

   temp.s_max[r] = -1;

   return lv;
}